

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBuiltinFunctions.hpp
# Opt level: O0

bool rsg::SinOp::transformValueRange(float outMin,float outMax,float *inMin,float *inMax)

{
  undefined4 local_30;
  undefined4 local_2c;
  float *inMax_local;
  float *inMin_local;
  float outMax_local;
  float outMin_local;
  
  if ((outMax < -1.0) || (1.0 < outMin)) {
    outMax_local._3_1_ = false;
  }
  else {
    if (outMin < -1.0) {
      local_2c = -1.5707964;
    }
    else {
      local_2c = deFloatAsin(outMin);
    }
    *inMin = local_2c;
    if (1.0 < outMax) {
      local_30 = 1.5707964;
    }
    else {
      local_30 = deFloatAsin(outMax);
    }
    *inMax = local_30;
    outMax_local._3_1_ = true;
  }
  return outMax_local._3_1_;
}

Assistant:

static inline bool transformValueRange (float outMin, float outMax, float& inMin, float& inMax)
	{
		if (outMax < -1.0f || outMin > 1.0f)
			return false;

		inMin = (outMin >= -1.0f) ? deFloatAsin(outMin) : -0.5f*DE_PI;
		inMax = (outMax <= +1.0f) ? deFloatAsin(outMax) : +0.5f*DE_PI;

		return true;
	}